

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop.cpp
# Opt level: O1

int __thiscall ncnn::BinaryOp::forward_inplace(BinaryOp *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  ulong uVar5;
  long lVar6;
  uint uVar7;
  void *pvVar8;
  float fVar9;
  
  switch(this->op_type) {
  case 0:
    iVar2 = bottom_top_blob->c;
    if (0 < (long)iVar2) {
      fVar1 = this->b;
      uVar7 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d;
      pvVar8 = bottom_top_blob->data;
      sVar3 = bottom_top_blob->elemsize;
      sVar4 = bottom_top_blob->cstep;
      lVar6 = 0;
      do {
        if (0 < (int)uVar7) {
          uVar5 = 0;
          do {
            *(float *)((long)pvVar8 + uVar5 * 4) = *(float *)((long)pvVar8 + uVar5 * 4) + fVar1;
            uVar5 = uVar5 + 1;
          } while (uVar7 != uVar5);
        }
        lVar6 = lVar6 + 1;
        pvVar8 = (void *)((long)pvVar8 + sVar3 * sVar4);
      } while (lVar6 != iVar2);
    }
    break;
  case 1:
    iVar2 = bottom_top_blob->c;
    if (0 < (long)iVar2) {
      fVar1 = this->b;
      uVar7 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d;
      pvVar8 = bottom_top_blob->data;
      sVar3 = bottom_top_blob->elemsize;
      sVar4 = bottom_top_blob->cstep;
      lVar6 = 0;
      do {
        if (0 < (int)uVar7) {
          uVar5 = 0;
          do {
            *(float *)((long)pvVar8 + uVar5 * 4) = *(float *)((long)pvVar8 + uVar5 * 4) - fVar1;
            uVar5 = uVar5 + 1;
          } while (uVar7 != uVar5);
        }
        lVar6 = lVar6 + 1;
        pvVar8 = (void *)((long)pvVar8 + sVar3 * sVar4);
      } while (lVar6 != iVar2);
    }
    break;
  case 2:
    iVar2 = bottom_top_blob->c;
    if (0 < (long)iVar2) {
      fVar1 = this->b;
      uVar7 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d;
      pvVar8 = bottom_top_blob->data;
      sVar3 = bottom_top_blob->elemsize;
      sVar4 = bottom_top_blob->cstep;
      lVar6 = 0;
      do {
        if (0 < (int)uVar7) {
          uVar5 = 0;
          do {
            *(float *)((long)pvVar8 + uVar5 * 4) = *(float *)((long)pvVar8 + uVar5 * 4) * fVar1;
            uVar5 = uVar5 + 1;
          } while (uVar7 != uVar5);
        }
        lVar6 = lVar6 + 1;
        pvVar8 = (void *)((long)pvVar8 + sVar3 * sVar4);
      } while (lVar6 != iVar2);
    }
    break;
  case 3:
    iVar2 = bottom_top_blob->c;
    if (0 < (long)iVar2) {
      uVar7 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d;
      pvVar8 = bottom_top_blob->data;
      sVar3 = bottom_top_blob->elemsize;
      sVar4 = bottom_top_blob->cstep;
      fVar1 = this->b;
      lVar6 = 0;
      do {
        if (0 < (int)uVar7) {
          uVar5 = 0;
          do {
            *(float *)((long)pvVar8 + uVar5 * 4) =
                 *(float *)((long)pvVar8 + uVar5 * 4) * (1.0 / fVar1);
            uVar5 = uVar5 + 1;
          } while (uVar7 != uVar5);
        }
        lVar6 = lVar6 + 1;
        pvVar8 = (void *)((long)pvVar8 + sVar3 * sVar4);
      } while (lVar6 != iVar2);
    }
    break;
  case 4:
    iVar2 = bottom_top_blob->c;
    if (0 < (long)iVar2) {
      fVar1 = this->b;
      uVar7 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d;
      pvVar8 = bottom_top_blob->data;
      sVar3 = bottom_top_blob->elemsize;
      sVar4 = bottom_top_blob->cstep;
      lVar6 = 0;
      do {
        if (0 < (int)uVar7) {
          uVar5 = 0;
          do {
            fVar9 = *(float *)((long)pvVar8 + uVar5 * 4);
            if (fVar9 <= fVar1) {
              fVar9 = fVar1;
            }
            *(float *)((long)pvVar8 + uVar5 * 4) = fVar9;
            uVar5 = uVar5 + 1;
          } while (uVar7 != uVar5);
        }
        lVar6 = lVar6 + 1;
        pvVar8 = (void *)((long)pvVar8 + sVar3 * sVar4);
      } while (lVar6 != iVar2);
    }
    break;
  case 5:
    iVar2 = bottom_top_blob->c;
    if (0 < (long)iVar2) {
      fVar1 = this->b;
      uVar7 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d;
      pvVar8 = bottom_top_blob->data;
      sVar3 = bottom_top_blob->elemsize;
      sVar4 = bottom_top_blob->cstep;
      lVar6 = 0;
      do {
        if (0 < (int)uVar7) {
          uVar5 = 0;
          do {
            fVar9 = *(float *)((long)pvVar8 + uVar5 * 4);
            if (fVar1 <= fVar9) {
              fVar9 = fVar1;
            }
            *(float *)((long)pvVar8 + uVar5 * 4) = fVar9;
            uVar5 = uVar5 + 1;
          } while (uVar7 != uVar5);
        }
        lVar6 = lVar6 + 1;
        pvVar8 = (void *)((long)pvVar8 + sVar3 * sVar4);
      } while (lVar6 != iVar2);
    }
    break;
  case 6:
    iVar2 = bottom_top_blob->c;
    if (0 < (long)iVar2) {
      fVar1 = this->b;
      uVar7 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d;
      pvVar8 = bottom_top_blob->data;
      sVar3 = bottom_top_blob->elemsize;
      sVar4 = bottom_top_blob->cstep;
      lVar6 = 0;
      do {
        if (0 < (int)uVar7) {
          uVar5 = 0;
          do {
            fVar9 = powf(*(float *)((long)pvVar8 + uVar5 * 4),fVar1);
            *(float *)((long)pvVar8 + uVar5 * 4) = fVar9;
            uVar5 = uVar5 + 1;
          } while (uVar7 != uVar5);
        }
        lVar6 = lVar6 + 1;
        pvVar8 = (void *)((long)pvVar8 + sVar3 * sVar4);
      } while (lVar6 != iVar2);
    }
    break;
  case 7:
    iVar2 = bottom_top_blob->c;
    if (0 < (long)iVar2) {
      fVar1 = this->b;
      uVar7 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d;
      pvVar8 = bottom_top_blob->data;
      sVar3 = bottom_top_blob->elemsize;
      sVar4 = bottom_top_blob->cstep;
      lVar6 = 0;
      do {
        if (0 < (int)uVar7) {
          uVar5 = 0;
          do {
            *(float *)((long)pvVar8 + uVar5 * 4) = fVar1 - *(float *)((long)pvVar8 + uVar5 * 4);
            uVar5 = uVar5 + 1;
          } while (uVar7 != uVar5);
        }
        lVar6 = lVar6 + 1;
        pvVar8 = (void *)((long)pvVar8 + sVar3 * sVar4);
      } while (lVar6 != iVar2);
    }
    break;
  case 8:
    iVar2 = bottom_top_blob->c;
    if (0 < (long)iVar2) {
      fVar1 = this->b;
      uVar7 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d;
      pvVar8 = bottom_top_blob->data;
      sVar3 = bottom_top_blob->elemsize;
      sVar4 = bottom_top_blob->cstep;
      lVar6 = 0;
      do {
        if (0 < (int)uVar7) {
          uVar5 = 0;
          do {
            *(float *)((long)pvVar8 + uVar5 * 4) = fVar1 / *(float *)((long)pvVar8 + uVar5 * 4);
            uVar5 = uVar5 + 1;
          } while (uVar7 != uVar5);
        }
        lVar6 = lVar6 + 1;
        pvVar8 = (void *)((long)pvVar8 + sVar3 * sVar4);
      } while (lVar6 != iVar2);
    }
    break;
  case 9:
    iVar2 = bottom_top_blob->c;
    if (0 < (long)iVar2) {
      fVar1 = this->b;
      uVar7 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d;
      pvVar8 = bottom_top_blob->data;
      sVar3 = bottom_top_blob->elemsize;
      sVar4 = bottom_top_blob->cstep;
      lVar6 = 0;
      do {
        if (0 < (int)uVar7) {
          uVar5 = 0;
          do {
            fVar9 = powf(fVar1,*(float *)((long)pvVar8 + uVar5 * 4));
            *(float *)((long)pvVar8 + uVar5 * 4) = fVar9;
            uVar5 = uVar5 + 1;
          } while (uVar7 != uVar5);
        }
        lVar6 = lVar6 + 1;
        pvVar8 = (void *)((long)pvVar8 + sVar3 * sVar4);
      } while (lVar6 != iVar2);
    }
    break;
  case 10:
    iVar2 = bottom_top_blob->c;
    if (0 < (long)iVar2) {
      fVar1 = this->b;
      uVar7 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d;
      pvVar8 = bottom_top_blob->data;
      sVar3 = bottom_top_blob->elemsize;
      sVar4 = bottom_top_blob->cstep;
      lVar6 = 0;
      do {
        if (0 < (int)uVar7) {
          uVar5 = 0;
          do {
            fVar9 = atan2f(*(float *)((long)pvVar8 + uVar5 * 4),fVar1);
            *(float *)((long)pvVar8 + uVar5 * 4) = fVar9;
            uVar5 = uVar5 + 1;
          } while (uVar7 != uVar5);
        }
        lVar6 = lVar6 + 1;
        pvVar8 = (void *)((long)pvVar8 + sVar3 * sVar4);
      } while (lVar6 != iVar2);
    }
    break;
  case 0xb:
    iVar2 = bottom_top_blob->c;
    if (0 < (long)iVar2) {
      fVar1 = this->b;
      uVar7 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d;
      pvVar8 = bottom_top_blob->data;
      sVar3 = bottom_top_blob->elemsize;
      sVar4 = bottom_top_blob->cstep;
      lVar6 = 0;
      do {
        if (0 < (int)uVar7) {
          uVar5 = 0;
          do {
            fVar9 = atan2f(fVar1,*(float *)((long)pvVar8 + uVar5 * 4));
            *(float *)((long)pvVar8 + uVar5 * 4) = fVar9;
            uVar5 = uVar5 + 1;
          } while (uVar7 != uVar5);
        }
        lVar6 = lVar6 + 1;
        pvVar8 = (void *)((long)pvVar8 + sVar3 * sVar4);
      } while (lVar6 != iVar2);
    }
  }
  return 0;
}

Assistant:

int BinaryOp::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    if (op_type == Operation_ADD) return binary_op_scalar_inplace<binary_op_add>(bottom_top_blob, b, opt);
    if (op_type == Operation_SUB) return binary_op_scalar_inplace<binary_op_sub>(bottom_top_blob, b, opt);
    if (op_type == Operation_MUL) return binary_op_scalar_inplace<binary_op_mul>(bottom_top_blob, b, opt);
    if (op_type == Operation_DIV) return binary_op_scalar_inplace<binary_op_div>(bottom_top_blob, b, opt);
    if (op_type == Operation_MAX) return binary_op_scalar_inplace<binary_op_max>(bottom_top_blob, b, opt);
    if (op_type == Operation_MIN) return binary_op_scalar_inplace<binary_op_min>(bottom_top_blob, b, opt);
    if (op_type == Operation_POW) return binary_op_scalar_inplace<binary_op_pow>(bottom_top_blob, b, opt);
    if (op_type == Operation_RSUB) return binary_op_scalar_inplace<binary_op_rsub>(bottom_top_blob, b, opt);
    if (op_type == Operation_RDIV) return binary_op_scalar_inplace<binary_op_rdiv>(bottom_top_blob, b, opt);
    if (op_type == Operation_RPOW) return binary_op_scalar_inplace<binary_op_rpow>(bottom_top_blob, b, opt);
    if (op_type == Operation_ATAN2) return binary_op_scalar_inplace<binary_op_atan2>(bottom_top_blob, b, opt);
    if (op_type == Operation_RATAN2) return binary_op_scalar_inplace<binary_op_ratan2>(bottom_top_blob, b, opt);

    // should nerver reach here
    return 0;
}